

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O3

double fas154(double *b,int pq,void *params)

{
  uint N;
  double *pdVar1;
  double *__ptr;
  double *__ptr_00;
  double *pdVar2;
  int iVar3;
  ulong uVar4;
  int ip;
  uint uVar5;
  uint iq;
  size_t sVar6;
  bool bVar7;
  double dVar8;
  double extraout_XMM0_Qa;
  double local_88;
  double ssq;
  double sumlog;
  int nit;
  int iter;
  double *local_68;
  double *local_60;
  double *local_58;
  double *local_50;
  ulong local_48;
  ulong local_40;
  double local_38;
  
  ssq = 0.0;
  local_88 = 0.0;
  local_38 = (double)(long)*params;
  local_48 = (ulong)*(uint *)((long)params + 8);
  N = *(uint *)((long)params + 0x18);
  iVar3 = *(int *)((long)params + 0xc);
  local_40 = (ulong)iVar3;
  sVar6 = local_40 << 3;
  _nit = (double *)malloc(sVar6);
  local_50 = (double *)malloc(sVar6);
  local_68 = (double *)malloc(sVar6);
  pdVar1 = _nit;
  sVar6 = (long)(((iVar3 + 1) * iVar3) / 2) << 3;
  local_60 = (double *)malloc(sVar6);
  pdVar2 = (double *)malloc(sVar6);
  if (0 < (long)local_38) {
    memcpy(pdVar1,b,(long)local_38 * 8);
  }
  iVar3 = (int)local_40;
  if ((int)SUB84(local_38,0) < iVar3) {
    memset(_nit + (long)local_38,0,(ulong)(~SUB84(local_38,0) + iVar3) * 8 + 8);
    iVar3 = (int)local_40;
  }
  ip = SUB84(local_38,0);
  local_58 = pdVar2;
  if (0 < (int)local_48) {
    memcpy(local_50,b + (long)local_38,local_48 * 8);
    iVar3 = (int)local_40;
    ip = SUB84(local_38,0);
  }
  uVar5 = (uint)local_48;
  iq = uVar5;
  if ((int)uVar5 < iVar3) {
    memset(local_50 + (int)uVar5,0,(ulong)(~uVar5 + iVar3) * 8 + 8);
    iq = (uint)local_48;
    ip = SUB84(local_38,0);
  }
  pdVar1 = _nit;
  if (0 < (int)N && *(int *)((long)params + 0x1c) == 1) {
    uVar4 = 0;
    do {
      *(double *)((long)params + uVar4 * 8 + 0x680) =
           *(double *)((long)params + uVar4 * 8 + (ulong)N * 0x10 + 0x680) - b[(int)(iq + ip)];
      uVar4 = uVar4 + 1;
    } while (N != uVar4);
  }
  bVar7 = ip != 1 || uVar5 != 0;
  if (bVar7) {
    starma(ip,iq,_nit,local_50,local_68,local_60,local_58);
    iq = (uint)local_48;
    ip = SUB84(local_38,0);
    dVar8 = extraout_XMM0_Qa;
  }
  else {
    *local_58 = 1.0;
    *local_68 = 0.0;
    dVar8 = *_nit * *_nit;
    *local_60 = 1.0 / (1.0 - dVar8);
  }
  __ptr_00 = local_58;
  __ptr = local_60;
  pdVar2 = local_68;
  local_40 = (ulong)bVar7;
  sumlog._0_4_ = 0;
  karma(ip,iq,pdVar1,&sumlog,local_68,local_60,local_58,N,(double *)((long)params + 0x680),
        (double *)((long)params + (long)(int)N * 8 + 0x680),&ssq,&local_88,(uint)bVar7,dVar8,
        (int *)((long)&sumlog + 4),(int *)&sumlog);
  *(double *)((long)params + 0x30) = local_88;
  local_38 = ssq / (double)sumlog._4_4_;
  dVar8 = log(local_88 / (double)sumlog._4_4_);
  local_38 = (dVar8 + local_38) * 0.5;
  *(double *)((long)params + 0x38) = local_38;
  free(pdVar1);
  free(local_50);
  free(pdVar2);
  free(__ptr);
  free(__ptr_00);
  return local_38;
}

Assistant:

double fas154(double *b,int pq,void *params) {
	double value,ssq,sumlog,delta;
	int ip, iq, ir,i,np,ifault,N,iupd,nit,iter;
	double *phi, *theta, *A,*P,*V;

	value = ssq = sumlog = 0.0;
	alik_object obj = (alik_object)params;

	ip = obj->p;
	iq = obj->q;
	ir = obj->r;
	N = obj->N;
	np = (ir * (ir + 1)) / 2;

	phi = (double*)malloc(sizeof(double)* ir);
	theta = (double*)malloc(sizeof(double)* ir);
	A = (double*)malloc(sizeof(double)* ir);
	P = (double*)malloc(sizeof(double)* np);
	V = (double*)malloc(sizeof(double)* np);
	//bt = (double*)malloc(sizeof(double)* (ip+iq));
	/*
	for (i = 0; i < ip + iq; ++i) {
		bt[i] = b[i];
	}

	pdlreg(ip, bt, b);
	pdlreg(iq, bt + ip, b + ip);
	*/
	for (i = 0; i < ip; ++i) {
		phi[i] = b[i];
	}
	for (i = ip; i < ir; ++i) {
		phi[i] = 0.0;
	}

	for (i = 0; i < iq; ++i) {
		theta[i] = b[i+ip];
	}
	for (i = iq; i < ir; ++i) {
		theta[i] = 0.0;
	}
	if (obj->M == 1) {
		for (i = 0; i < N; ++i) {
			obj->x[i] = obj->x[2 * N + i] - b[ip + iq];
		}
	}

	iupd = 0;

	if (ip == 1 && iq == 0) {
		*V = 1.0;
		*A = 0.0;
		*P = 1.0 / (1.0 - phi[0] * phi[0]);
	}
	else {
		iupd = 1;
		ifault = starma(ip, iq, phi, theta, A, P, V);
	}
	
	nit = 0;
	delta = 0.001;
	//mdisplay(P, 1, np);
	karma(ip, iq, phi, theta, A, P, V, N, obj->x, obj->x + N, &sumlog, &ssq, iupd, delta,&iter, &nit);
	obj->ssq = ssq;
	//mdisplay(phi, 1, ip);
	value = 0.5 * (sumlog/(double)iter + log(ssq/(double) iter));
	obj->loglik = value;

	//printf("sumlog ssq %g %g %d \n", sumlog,value,iter);

	free(phi);
	free(theta);
	free(A);
	free(P);
	free(V);
	//free(bt);
	return value;
}